

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# y4m_video_source.h
# Opt level: O0

void __thiscall libaom_test::Y4mVideoSource::FillFrame(Y4mVideoSource *this)

{
  bool bVar1;
  char *in_RDI;
  Message *in_stack_00000018;
  AssertHelper *in_stack_00000020;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffffa0;
  _IO_FILE **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  uint uVar2;
  FILE *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  Type in_stack_ffffffffffffffcc;
  AssertHelper *in_stack_ffffffffffffffd0;
  AssertionResult local_18;
  
  testing::internal::CmpHelperNE<_IO_FILE*,decltype(nullptr)>
            ((char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
             in_stack_ffffffffffffffa8,&in_stack_ffffffffffffffa0->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffffd0);
    testing::AssertionResult::failure_message((AssertionResult *)0x3c81a8);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc,(char *)in_stack_ffffffffffffffc0
               ,in_stack_ffffffffffffffbc,in_RDI);
    testing::internal::AssertHelper::operator=(in_stack_00000020,in_stack_00000018);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffffa0);
    testing::Message::~Message((Message *)0x3c81f6);
  }
  uVar2 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x3c8259);
  if (uVar2 == 0) {
    std::unique_ptr<aom_image,_std::default_delete<aom_image>_>::get
              (*(unique_ptr<aom_image,_std::default_delete<aom_image>_> **)(in_RDI + 0x28));
    y4m_input_fetch_frame
              ((y4m_input *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc0,(aom_image_t *)CONCAT44(uVar2,in_stack_ffffffffffffffb8));
  }
  return;
}

Assistant:

virtual void FillFrame() {
    ASSERT_NE(input_file_, nullptr);
    // Read a frame from input_file.
    y4m_input_fetch_frame(&y4m_, input_file_, img_.get());
  }